

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O0

void polymul_internal::polynomial_multiplier<double,_2,_0,_2>::mul_monomial
               (double *dst,double *p1,double *m2)

{
  double dVar1;
  int iVar2;
  int local_24;
  int i;
  double *m2_local;
  double *p1_local;
  double *dst_local;
  
  local_24 = binomial(3,1);
  while( true ) {
    iVar2 = binomial(4,2);
    if (iVar2 <= local_24) break;
    dVar1 = *p1;
    iVar2 = binomial(3,1);
    dst[local_24] = dVar1 * m2[local_24 - iVar2] + dst[local_24];
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

static void mul_monomial(numtype POLYMUL_RESTRICT dst[],
                           const numtype p1[],
                           const numtype m2[]) {
    for (int i = binomial(Nvar + Ndeg2 - 1, Ndeg2 - 1);
         i < binomial(Nvar + Ndeg2, Ndeg2);
         i++)
      dst[i] += p1[0] * m2[i - binomial(Nvar + Ndeg2 - 1, Ndeg2 - 1)];
  }